

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlat<long,long,long,duckdb::BinaryNumericDivideWrapper,duckdb::ModuloOperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  ValidityMask *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  undefined7 in_register_00000081;
  idx_t local_68;
  undefined4 local_5c;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  long *local_48;
  long *local_40;
  long *local_38;
  
  local_38 = (long *)left->data;
  local_40 = (long *)right->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  local_48 = (long *)result->data;
  FlatVector::VerifyFlatVector(result);
  this = &result->validity;
  FlatVector::VerifyFlatVector(left);
  (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = count;
  local_68 = count;
  if ((left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    p_Var1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
  }
  else {
    local_5c = (undefined4)CONCAT71(in_register_00000081,fun);
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
              ((duckdb *)&local_58,(unsigned_long **)&left->validity,&local_68);
    p_Var4 = p_Stack_50;
    peVar3 = local_58;
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar3;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
    }
    pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                       );
    _Var2.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (pTVar5->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
    (this->super_TemplatedValidityMask<unsigned_long>).validity_mask =
         (unsigned_long *)_Var2.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    fun = SUB41(local_5c,0);
    if (_Var2.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
      FlatVector::VerifyFlatVector(right);
      ValidityMask::Combine(this,&right->validity,count);
      goto LAB_009d04f6;
    }
  }
  FlatVector::VerifyFlatVector(right);
  (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = count;
  if ((right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    p_Var1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68 = count;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    _Var6._M_head_impl = (unsigned_long *)0x0;
  }
  else {
    local_68 = count;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
              ((duckdb *)&local_58,(unsigned_long **)&right->validity,&local_68);
    p_Var4 = p_Stack_50;
    peVar3 = local_58;
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar3;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
    }
    pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                       );
    _Var6._M_head_impl =
         (pTVar5->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  }
  (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var6._M_head_impl;
LAB_009d04f6:
  ExecuteFlatLoop<long,long,long,duckdb::BinaryNumericDivideWrapper,duckdb::ModuloOperator,bool,false,false>
            (local_38,local_40,local_48,count,this,fun);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}